

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PcaModel.hpp
# Opt level: O3

MatrixXf * __thiscall
eos::morphablemodel::PcaModel::get_rescaled_pca_basis_at_point
          (MatrixXf *__return_storage_ptr__,PcaModel *this,int vertex_id)

{
  float *pfVar1;
  float *local_40;
  undefined8 local_38;
  long local_30;
  MatrixXf *local_28;
  long local_20;
  undefined8 local_18;
  long local_10;
  
  local_10 = (this->rescaled_pca_basis).
             super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
  if ((int)local_10 <= vertex_id * 3) {
    __assert_fail("vertex_id < get_data_dimension()",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/morphablemodel/PcaModel.hpp"
                  ,0xe2,
                  "Eigen::MatrixXf eos::morphablemodel::PcaModel::get_rescaled_pca_basis_at_point(int) const"
                 );
  }
  local_20 = (long)(vertex_id * 3);
  pfVar1 = (this->rescaled_pca_basis).
           super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data;
  local_30 = (this->rescaled_pca_basis).
             super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
  local_40 = pfVar1 + local_20;
  local_38 = 3;
  if (-1 < local_30 || pfVar1 == (float *)0x0) {
    local_28 = &this->rescaled_pca_basis;
    local_18 = 0;
    if (((-1 < vertex_id) && (-1 < local_30)) && (local_20 <= local_10 + -3)) {
      Eigen::PlainObjectBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,_1,false>>
                ((PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)__return_storage_ptr__,
                 (DenseBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                  *)&local_40);
      return __return_storage_ptr__;
    }
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Block.h"
                  ,0x93,
                  "Eigen::Block<const Eigen::Matrix<float, -1, -1>>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<float, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                 );
  }
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/MapBase.h"
                ,0xb2,
                "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<float, -1, -1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<float, -1, -1>>, Level = 0]"
               );
}

Assistant:

Eigen::MatrixXf get_rescaled_pca_basis_at_point(int vertex_id) const
    {
        vertex_id *= 3;                           // the basis is stored in the format [x y z x y z ...]
        assert(vertex_id < get_data_dimension()); // Make sure the given vertex index isn't larger than the
                                                  // number of model vertices.
        return rescaled_pca_basis.block(vertex_id, 0, 3, rescaled_pca_basis.cols());
    }